

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t roaring_bitmap_maximum(roaring_bitmap_t *bm)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t lowvalue;
  uint32_t key;
  uint8_t typecode;
  container_t *container;
  roaring_bitmap_t *bm_local;
  
  if ((bm->high_low_container).size < 1) {
    bm_local._4_4_ = 0;
  }
  else {
    uVar1 = (bm->high_low_container).keys[(bm->high_low_container).size + -1];
    uVar2 = container_maximum((bm->high_low_container).containers
                              [(bm->high_low_container).size + -1],
                              (bm->high_low_container).typecodes[(bm->high_low_container).size + -1]
                             );
    bm_local._4_4_ = CONCAT22(uVar1,uVar2);
  }
  return bm_local._4_4_;
}

Assistant:

uint32_t roaring_bitmap_maximum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *container =
            bm->high_low_container.containers[bm->high_low_container.size - 1];
        uint8_t typecode =
            bm->high_low_container.typecodes[bm->high_low_container.size - 1];
        uint32_t key =
            bm->high_low_container.keys[bm->high_low_container.size - 1];
        uint32_t lowvalue = container_maximum(container, typecode);
        return lowvalue | (key << 16);
    }
    return 0;
}